

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O0

void __thiscall
PushPopTest_TimeMeasurement_Test::~PushPopTest_TimeMeasurement_Test
          (PushPopTest_TimeMeasurement_Test *this)

{
  PushPopTest_TimeMeasurement_Test *unaff_retaddr;
  
  ~PushPopTest_TimeMeasurement_Test(unaff_retaddr);
  return;
}

Assistant:

TEST_P(PushPopTest, TimeMeasurement) {
    std::size_t n = GetParam();

    resetRandom();
    MEASURE_TIME_BEGIN(stdDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        stdDeque.push_back(x);
        int y = nextRandom();
        stdDeque.push_front(y);
    }

    while (!stdDeque.empty()) {
        stdDeque.pop_back();
    }
    MEASURE_TIME_END(stdDequeMs);

    resetRandom();
    MEASURE_TIME_BEGIN(myDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
    }

    while (!myDeque.empty()) {
        myDeque.pop_back();
    }
    MEASURE_TIME_END(myDequeMs);

    std::cout   << "std::deque time: " << stdDequeMs << " ms." << std::endl
                << "My Deque time: " << myDequeMs << " ms." << std::endl;
}